

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

ssize_t __thiscall QFSFileEngine::read(QFSFileEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  QFSFileEnginePrivate *pQVar1;
  qint64 qVar2;
  QFSFileEnginePrivate *d;
  qint64 in_stack_00000038;
  char *in_stack_00000040;
  QFSFileEnginePrivate *in_stack_00000048;
  
  pQVar1 = d_func((QFSFileEngine *)0x2bdc55);
  if (pQVar1->lastIOCommand != IOReadCommand) {
    (*(this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[4])();
    pQVar1->lastIOCommand = IOReadCommand;
  }
  qVar2 = QFSFileEnginePrivate::nativeRead(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  return qVar2;
}

Assistant:

qint64 QFSFileEngine::read(char *data, qint64 maxlen)
{
    Q_D(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (d->lastIOCommand != QFSFileEnginePrivate::IOReadCommand) {
        flush();
        d->lastIOCommand = QFSFileEnginePrivate::IOReadCommand;
    }

    return d->nativeRead(data, maxlen);
}